

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O3

void flip_drawbridge_horizontal(rm *loc)

{
  uint uVar1;
  uint uVar2;
  
  if ((loc->typ == '$') || (loc->typ == '\x14')) {
    uVar1 = *(uint *)&loc->field_0x6;
    uVar2 = uVar1 >> 4 & 3;
    if (uVar2 == 2) {
      uVar1 = uVar1 | 0x30;
    }
    else {
      if (uVar2 != 3) {
        return;
      }
      uVar1 = uVar1 & 0xffffffcf | 0x20;
    }
    *(uint *)&loc->field_0x6 = uVar1;
  }
  return;
}

Assistant:

static void flip_drawbridge_horizontal(struct rm *loc)
{
	if (IS_DRAWBRIDGE(loc->typ)) {
	    if ((loc->drawbridgemask & DB_DIR) == DB_WEST) {
		loc->drawbridgemask &= ~DB_WEST;
		loc->drawbridgemask |=  DB_EAST;
	    } else if ((loc->drawbridgemask & DB_DIR) == DB_EAST) {
		loc->drawbridgemask &= ~DB_EAST;
		loc->drawbridgemask |=  DB_WEST;
	    }
	}
}